

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::HaveFortranSources(cmGeneratorTarget *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  __normal_iterator<cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
  __it;
  long lVar4;
  pointer pAVar5;
  pointer this_00;
  pointer config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  sources;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  sourceObjectLibraries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  local_78;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  __it._M_current = (AllConfigSource *)&this->AllConfigSources;
  if ((this->AllConfigSources).
      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->AllConfigSources).
      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ComputeAllConfigSources(this);
  }
  std::
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>::
  vector(&local_78,
         (vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
          *)__it._M_current);
  lVar4 = ((long)local_78.
                 super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_78.
                 super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 >> 2;
  this_00 = local_78.
            super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::$_0>::
              operator()((_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::__0> *)this_00,
                         __it);
      pAVar5 = this_00;
      if (bVar2) goto LAB_00627369;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::$_0>::
              operator()((_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::__0> *)
                         (this_00 + 1),__it);
      pAVar5 = this_00 + 1;
      if (bVar2) goto LAB_00627369;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::$_0>::
              operator()((_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::__0> *)
                         (this_00 + 2),__it);
      pAVar5 = this_00 + 2;
      if (bVar2) goto LAB_00627369;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::$_0>::
              operator()((_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::__0> *)
                         (this_00 + 3),__it);
      pAVar5 = this_00 + 3;
      if (bVar2) goto LAB_00627369;
      this_00 = this_00 + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = ((long)local_78.
                 super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3) *
          -0x3333333333333333;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pAVar5 = local_78.
               super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::$_0>::
                  operator()((_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::__0> *)
                             this_00,__it), pAVar5 = this_00, bVar2)) goto LAB_00627369;
      this_00 = this_00 + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::$_0>::
            operator()((_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::__0> *)this_00,__it
                      );
    pAVar5 = this_00;
    if (bVar2) goto LAB_00627369;
    this_00 = this_00 + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::$_0>::
          operator()((_Iter_pred<cmGeneratorTarget::HaveFortranSources()const::__0> *)this_00,__it);
  pAVar5 = this_00;
  if (!bVar2) {
    pAVar5 = local_78.
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00627369:
  if (pAVar5 == local_78.
                super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_90,this->Makefile,IncludeEmptyConfig);
    if (local_90.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_90.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      config = local_90.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        GetSourceObjectLibraries
                  ((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    *)&local_60,this,config);
        p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        while (((_Rb_tree_header *)p_Var3 != p_Var1 &&
               (bVar2 = HaveFortranSources(*(cmGeneratorTarget **)(p_Var3 + 1),config), !bVar2))) {
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        }
        std::
        _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::~_Rb_tree(&local_60);
        bVar2 = (_Rb_tree_header *)p_Var3 != p_Var1;
        if (bVar2) goto LAB_00627400;
        config = config + 1;
      } while (config != local_90.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar2 = false;
LAB_00627400:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
  }
  else {
    bVar2 = false;
  }
  std::
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>::
  ~vector(&local_78);
  return (bool)(pAVar5 != local_78.
                          super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                          ._M_impl.super__Vector_impl_data._M_finish | bVar2);
}

Assistant:

std::vector<cmGeneratorTarget::AllConfigSource> const&
cmGeneratorTarget::GetAllConfigSources() const
{
  if (this->AllConfigSources.empty()) {
    this->ComputeAllConfigSources();
  }
  return this->AllConfigSources;
}